

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O0

void __thiscall FIWadManager::ParseIWadInfos(FIWadManager *this,char *fn)

{
  char *fn_00;
  int iVar1;
  uint uVar2;
  FResourceFile *this_00;
  undefined4 extraout_var;
  char *data;
  FResourceLump *lmp;
  int i;
  DWORD cnt;
  FResourceFile *resfile;
  char *fn_local;
  FIWadManager *this_local;
  FResourceLump *this_01;
  
  this_00 = FResourceFile::OpenResourceFile(fn,(FileReader *)0x0,true,false);
  if (this_00 != (FResourceFile *)0x0) {
    lmp._0_4_ = FResourceFile::LumpCount(this_00);
    do {
      lmp._0_4_ = (DWORD)lmp - 1;
      if ((int)(DWORD)lmp < 0) goto LAB_004630c5;
      iVar1 = (*this_00->_vptr_FResourceFile[4])(this_00,(ulong)(DWORD)lmp);
      this_01 = (FResourceLump *)CONCAT44(extraout_var,iVar1);
    } while ((this_01->Namespace != 0) ||
            (iVar1 = strcasecmp((this_01->field_3).Name,"IWADINFO"), iVar1 != 0));
    fn_00 = this_00->Filename;
    data = (char *)FResourceLump::CacheLump(this_01);
    ParseIWadInfo(this,fn_00,data,this_01->LumpSize);
LAB_004630c5:
    if (this_00 != (FResourceFile *)0x0) {
      (*this_00->_vptr_FResourceFile[1])();
    }
  }
  uVar2 = TArray<FString,_FString>::Size(&this->mIWadNames);
  if ((uVar2 == 0) || (uVar2 = TArray<FIWADInfo,_FIWADInfo>::Size(&this->mIWads), uVar2 == 0)) {
    I_FatalError("No IWAD definitions found");
  }
  return;
}

Assistant:

void FIWadManager::ParseIWadInfos(const char *fn)
{
	FResourceFile *resfile = FResourceFile::OpenResourceFile(fn, NULL, true);
	if (resfile != NULL)
	{
		DWORD cnt = resfile->LumpCount();
		for(int i=cnt-1; i>=0; i--)
		{
			FResourceLump *lmp = resfile->GetLump(i);

			if (lmp->Namespace == ns_global && !stricmp(lmp->Name, "IWADINFO"))
			{
				// Found one!
				ParseIWadInfo(resfile->Filename, (const char*)lmp->CacheLump(), lmp->LumpSize);
				break;
			}
		}
		delete resfile;
	}
	if (mIWadNames.Size() == 0 || mIWads.Size() == 0)
	{
		I_FatalError("No IWAD definitions found");
	}
}